

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  initializer_list<int> __l;
  int iVar2;
  ostream *poVar3;
  Expression<int,_std::greater<int>_> EVar4;
  _Filter<Expression<int,_std::greater<int>_>_> _Var5;
  _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
  local_1e0;
  _Drop local_1c4;
  anon_class_1_0_00000001_for__fnc local_1bd;
  _Filter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vstrisovsky[P]blue_fnc_examples_examples_cpp:120:18)>
  local_1bc [2];
  anon_class_1_0_00000001_for__fnc local_1ba;
  _Map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vstrisovsky[P]blue_fnc_examples_examples_cpp:119:15),_void>
  local_1b9;
  _Range<unsigned_long> local_1b8;
  ResultType local_190;
  int local_174;
  ulong uStack_170;
  int v_1;
  size_t i;
  undefined1 local_160 [4];
  int c;
  vector<int,_std::allocator<int>_> tv;
  timer tm;
  size_t perfCount;
  int local_130;
  Expression<int,_std::greater<int>_> local_12c;
  _Filter<Expression<int,_std::greater<int>_>_> local_124;
  anon_class_1_0_00000001_for__fnc local_11a;
  _Map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vstrisovsky[P]blue_fnc_examples_examples_cpp:49:14),_void>
  local_119;
  int local_118 [10];
  initializer_list<int> local_f0;
  _From<const_int_*> local_e0;
  Functions local_ca;
  allocator<int> local_c9;
  int iStack_c8;
  Functions fnc;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> v;
  string local_68 [55];
  allocator local_31;
  string local_30 [36];
  int local_c;
  
  local_c = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Hamming distance: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"ACCAGGG",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"ACTATGG",
             (allocator *)
             ((long)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_end_of_storage + 7));
  iVar2 = hamming((string *)local_30,(string *)local_68);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_end_of_storage + 7));
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  _iStack_c8 = 0x300000001;
  std::allocator<int>::allocator(&local_c9);
  __l._M_len = 0xc;
  __l._M_array = &iStack_c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,__l,&local_c9);
  std::allocator<int>::~allocator(&local_c9);
  local_118[4] = 5;
  local_118[5] = 4;
  local_118[6] = 3;
  local_118[7] = 2;
  local_118[0] = 9;
  local_118[1] = 8;
  local_118[2] = 7;
  local_118[3] = 6;
  local_118[8] = 1;
  local_118[9] = 0;
  local_f0._M_array = local_118;
  local_f0._M_len = 10;
  local_e0 = from<int>(&local_f0);
  map<main::__0>(&local_11a);
  local_130 = 5;
  EVar4 = operator>((Placeholder *)&_,&local_130);
  local_12c.value = EVar4.value;
  _Var5 = filter<Expression<int,std::greater<int>>>(&local_12c);
  local_124._fnc.value = _Var5._fnc.value;
  foreach<main::__1>((anon_class_1_0_00000001_for__fnc *)((long)&perfCount + 6));
  Functions::operator()
            (&local_ca,&local_e0,&local_119,&local_124,
             (_ForEach<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vstrisovsky[P]blue_fnc_examples_examples_cpp:51:18)>
              *)((long)&perfCount + 7));
  boost::timer::timer((timer *)&tv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_160);
  i._4_4_ = 0;
  for (uStack_170 = 0; uStack_170 < 100000000; uStack_170 = uStack_170 + 1) {
    local_174 = (int)uStack_170 * (int)uStack_170;
    if ((uStack_170 < 50000000) && (local_174 % 2 != 0)) {
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)local_160,&local_174);
    }
    i._4_4_ = i._4_4_ + 1;
  }
  std::operator<<((ostream *)&std::cout,"\n------\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Raw: ");
  dVar1 = boost::timer::elapsed
                    ((timer *)&tv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)&std::cout,"------\n");
  boost::timer::restart
            ((timer *)&tv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  range<unsigned_long>(&local_1b8,100000000);
  map<main::__2>(&local_1ba);
  filter<main::__3>(&local_1bd);
  local_1c4 = drop(50000000);
  into<std::vector<int,std::allocator<int>>,BackInserter<std::vector<int,std::allocator<int>>>>();
  Functions::operator()(&local_190,&local_ca,&local_1b8,&local_1b9,local_1bc,&local_1c4,&local_1e0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_190);
  _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
  ::~_Into(&local_1e0);
  poVar3 = std::operator<<((ostream *)&std::cout,"blue-fnc: ");
  dVar1 = boost::timer::elapsed
                    ((timer *)&tv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  std::operator<<(poVar3,"\n");
  local_c = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_160);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88);
  return local_c;
}

Assistant:

int main(void)
{
  std::cout << "Hamming distance: " << hamming("ACCAGGG", "ACTATGG") << std::endl;

  std::vector<int> v = {1,3,5,67,33,56,44,45,67,76,67,789};

  Functions fnc;

  fnc(   from({9,8,7,6,5,4,3,2,1,0})
     ,   map([](int i){ return i*i;})
     ,   filter(_ > 5)
     ,   foreach([](int i){std::cout << i << " ";})
     );
    // std::cout << "------\n";
    // _(   Range(1000)
    //  ,   Filter([](int i) {return (i % 2) == 0;})
    //  ,   Take(20)
    //  ,   Map([](int i){return i+i;})
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   Range()
    //  ,   Zip(From(v))
    //  ,   Zip(Range(100))
    //  ,   ForEach([](std::tuple<int, int, int>&& v){std::cout << std::get<0>(v) << ":" << std::get<1>(v) << ":" << std::get<2>(v) << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   From({A{2000}, A{3}})
    //  ,   Map(&A::value)
    //  ,   Filter([](int i){return i > 10;})
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   From({A{2000}, A{3}})
    //  ,   Map(&A::x)
    //  ,   Filter([](int i){return i > 10;})
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    // std::cout << "------\n";
    // _(   Range(1000)
    //  ,   Drop(998)
    //  ,   ForEach([](int i){std::cout << i << "\n";})
    //  );
    //  std::cout << "------\n";
    //  _(   Range(10, 0)
    //   ,   Take(14)
    //   ,   ForEach([](int i){std::cout << i << "\n";})
    //   );
    //
    // std::cout << "------\n";
    // int sum = _(   Range(5)
    //            ,   Reduce(0, [](int a, int b){ return a + b;})
    //            );
    // std::cout << "Sum is: " << sum << "\n";
    // std::cout << "------\n";

    size_t perfCount = 100000000;

    boost::timer tm;

    std::vector<int> tv;
    int c = 0;
    for(size_t i = 0; i < perfCount; ++i)
    {
        int v = i * i;
        if(i < perfCount/2 && v%2)
        {
            tv.emplace_back(v);
        }
        ++c;
    };
    std::cout << "\n------\n";
    std::cout << "Raw: " << tm.elapsed() << "\n";

    std::cout << "------\n";

    tm.restart();

    fnc( range(perfCount)
        , map([](int i) {return i * i;})
        , filter([](int i){ return i % 2;})
        , drop(perfCount/2)
        , into<std::vector<int>>()
        );

    std::cout << "blue-fnc: " << tm.elapsed() << "\n";

    // auto sample = []()
    // {
    //     double x = (double)rand() / RAND_MAX;
    //     double y = (double)rand() / RAND_MAX;
    //     return (x*x + y*y) < 1 ? 1 : 0;
    // };
    //
    // const int numSamples = 1000000;
    // auto count = _( Range(numSamples)
    //               , Map([sample](int){ return sample();})
    //               , Reduce(0, [](int a, int b){ return a + b;})
    //               );
    //
    // std::cout << "Pi: " << 4.0 * (double) count / (double) numSamples << "\n";

    return EXIT_SUCCESS;
}